

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void init_films(void)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  film **ppfVar5;
  unique_ptr<spatial_region,_std::default_delete<spatial_region>_> this;
  int iVar6;
  film *pfVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM8_Qb;
  
  pfVar7 = p_last_film;
  if (p_last_film != (film *)0x0) {
    do {
      if (((pfVar7->xnpic_film == 0) || (pfVar7->ynpic_film == 0)) || (pfVar7->znpic_film == 0)) {
        pfVar7->xnpic_film = xnpic;
        pfVar7->ynpic_film = ynpic;
        pfVar7->znpic_film = znpic;
      }
      dVar1 = pfVar7->ne;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pfVar7->ne_y0 = dVar1;
        pfVar7->ne_y1 = dVar1;
      }
      this._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
      super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
      super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
           psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t
           .super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
           super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dx;
      auVar10._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[mpi_rank];
      auVar10._8_8_ = in_XMM8_Qb;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = pfVar7->x0;
      dVar1 = pfVar7->ne_y0;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = pfVar7->x0 + pfVar7->filmwidth;
      auVar14 = vfnmadd231sd_fma(auVar14,auVar9,auVar10);
      auVar9 = vfnmadd213sd_fma(auVar10,auVar9,auVar11);
      dVar8 = (11148500000000.0 / lambda) / lambda;
      dVar2 = pfVar7->ne_y1;
      iVar6 = std::__cxx11::string::compare((char *)&ions_abi_cxx11_);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = nerflow;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = nelflow;
      uVar3 = vcmppd_avx512vl(auVar13,ZEXT816(0) << 0x40,4);
      uVar4 = vcmppd_avx512vl(auVar12,ZEXT816(0) << 0x40,4);
      spatial_region::film
                ((spatial_region *)
                 this._M_t.
                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                 super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,auVar9._0_8_,
                 auVar14._0_8_,dVar1 / dVar8,dVar2 / dVar8,(uint)(iVar6 == 0),
                 1.0 / (pfVar7->mcr * 1836.1526721),pfVar7->gradwidth,pfVar7->y0,pfVar7->y1,
                 pfVar7->z0,pfVar7->z1,pfVar7->T,pfVar7->vx,
                 (bool)(((byte)uVar3 & 3 | (byte)uVar4 & 3) & 1),pfVar7->xnpic_film,
                 pfVar7->ynpic_film,pfVar7->znpic_film,false,pfVar7->gradwidth_y);
      ppfVar5 = &pfVar7->prev;
      pfVar7 = *ppfVar5;
    } while (*ppfVar5 != (film *)0x0);
  }
  return;
}

Assistant:

void init_films()
{
    film* tmp_p_film = p_last_film;
    while (tmp_p_film!=0)
    {
        /* x0film - координата левой границы плёнки, filmwidth - её
         * толщина, gradwidth - толщина части плёнки с линейным ростом
         * плотности */
        if (tmp_p_film->xnpic_film == 0 || tmp_p_film->ynpic_film == 0 || tmp_p_film->znpic_film == 0)
        {
            tmp_p_film->xnpic_film = xnpic;
            tmp_p_film->ynpic_film = ynpic;
            tmp_p_film->znpic_film = znpic;
        }
        if (tmp_p_film->ne != 0)
        {
            tmp_p_film->ne_y0 = tmp_p_film->ne;
            tmp_p_film->ne_y1 = tmp_p_film->ne;
        }

        psr->film(
            tmp_p_film->x0-dx*x0_sr[mpi_rank], 
            tmp_p_film->x0+tmp_p_film->filmwidth-dx*x0_sr[mpi_rank],
            tmp_p_film->ne_y0/(1.11485e+13/lambda/lambda),
            tmp_p_film->ne_y1/(1.11485e+13/lambda/lambda),
            ions == "on",
            1/(proton_mass*tmp_p_film->mcr),
            tmp_p_film->gradwidth,
            tmp_p_film->y0,
            tmp_p_film->y1,
            tmp_p_film->z0,
            tmp_p_film->z1,
            tmp_p_film->T,
            tmp_p_film->vx,
            nelflow != 0 || nerflow != 0,
            tmp_p_film->xnpic_film,
            tmp_p_film->ynpic_film,
            tmp_p_film->znpic_film,
            false,
            tmp_p_film->gradwidth_y
        );
        tmp_p_film = tmp_p_film->prev;
    }
}